

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer_test.cc
# Opt level: O3

void __thiscall
writer_test_should_write_char_field_Test::~writer_test_should_write_char_field_Test
          (writer_test_should_write_char_field_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(writer_test, should_write_char_field)
{
    using Field = Fixpp::Field<Fixpp::Tag::OrdStatus>;
    Field field;
    field.set('4');

    std::ostringstream oss;
    writeField(oss, field);

    ASSERT_EQ(oss.str(), "39=4|");
}